

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.h
# Opt level: O2

bool __thiscall Hasher::operator()(Hasher *this,string *a,string *b)

{
  __type _Var1;
  
  this->num_compares_ = this->num_compares_ + 1;
  _Var1 = std::operator==(a,b);
  return _Var1;
}

Assistant:

bool operator()(const string& a, const string& b) const {
    num_compares_++;
    return a == b;
  }